

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

int IsRegister(char *zeexpression)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  
  cVar4 = *zeexpression;
  if (cVar4 == '\0') {
    uVar3 = 0x12345678;
  }
  else {
    pcVar2 = zeexpression + 1;
    uVar3 = 0x12345678;
    do {
      uVar3 = (int)cVar4 + uVar3 ^ uVar3 << 9;
      cVar4 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar4 != '\0');
  }
  bVar5 = false;
  if ((int)uVar3 < 0x4bd5311b) {
    if ((int)uVar3 < 0x4bd5071c) {
      if ((int)uVar3 < -0x1e60e89b) {
        if (uVar3 == 0xe19f1162) {
          pcVar2 = "IYH";
        }
        else if (uVar3 == 0xe19f1166) {
          pcVar2 = "IYL";
        }
        else {
          if (uVar3 != 0xe19f1761) goto switchD_001139db_caseD_7a98a6bf;
          pcVar2 = "IXH";
        }
      }
      else if ((int)uVar3 < 0x4bd5051d) {
        if (uVar3 == 0xe19f1765) {
          pcVar2 = "IXL";
        }
        else {
          if (uVar3 != 0x4bd50519) goto switchD_001139db_caseD_7a98a6bf;
          pcVar2 = "YH";
        }
      }
      else if (uVar3 == 0x4bd5051d) {
        pcVar2 = "YL";
      }
      else {
        if (uVar3 != 0x4bd50718) goto switchD_001139db_caseD_7a98a6bf;
        pcVar2 = "XH";
      }
    }
    else if ((int)uVar3 < 0x4bd52718) {
      if ((int)uVar3 < 0x4bd5251a) {
        if (uVar3 == 0x4bd5071c) {
          pcVar2 = "XL";
        }
        else {
          bVar5 = false;
          if (uVar3 != 0x4bd52519) goto switchD_001139db_caseD_7a98a6bf;
          pcVar2 = "IX";
        }
      }
      else if (uVar3 == 0x4bd5251a) {
        pcVar2 = "IY";
      }
      else {
        if (uVar3 != 0x4bd5270c) goto switchD_001139db_caseD_7a98a6bf;
        pcVar2 = "HL";
      }
    }
    else if ((int)uVar3 < 0x4bd52f1c) {
      if (uVar3 == 0x4bd52718) {
        pcVar2 = "HX";
      }
      else {
        if (uVar3 != 0x4bd52719) goto switchD_001139db_caseD_7a98a6bf;
        pcVar2 = "HY";
      }
    }
    else if (uVar3 == 0x4bd52f1c) {
      pcVar2 = "LX";
    }
    else {
      if (uVar3 != 0x4bd52f1d) goto switchD_001139db_caseD_7a98a6bf;
      pcVar2 = "LY";
    }
  }
  else if ((int)uVar3 < 0x4bd5df01) {
    if (uVar3 == 0x4bd5311b) {
      pcVar2 = "SP";
    }
    else if (uVar3 == 0x4bd5d2fd) {
      pcVar2 = "BC";
    }
    else {
      if (uVar3 != 0x4bd5d4ff) goto switchD_001139db_caseD_7a98a6bf;
      pcVar2 = "AF";
    }
  }
  else {
    switch(uVar3) {
    case 0x7a98a6b9:
      pcVar2 = "A";
      break;
    case 0x7a98a6ba:
      pcVar2 = "B";
      break;
    case 0x7a98a6bb:
      pcVar2 = "C";
      break;
    case 0x7a98a6bc:
      pcVar2 = "D";
      break;
    case 0x7a98a6bd:
      pcVar2 = "E";
      break;
    case 0x7a98a6be:
      pcVar2 = "F";
      break;
    case 0x7a98a6bf:
    case 0x7a98a6c2:
    case 0x7a98a6c3:
    case 0x7a98a6c5:
    case 0x7a98a6c6:
    case 0x7a98a6c7:
    case 0x7a98a6c8:
    case 0x7a98a6c9:
      goto switchD_001139db_caseD_7a98a6bf;
    case 0x7a98a6c0:
      pcVar2 = "H";
      break;
    case 0x7a98a6c1:
      pcVar2 = "I";
      break;
    case 0x7a98a6c4:
      pcVar2 = "L";
      break;
    case 0x7a98a6ca:
      pcVar2 = "R";
      break;
    default:
      if (uVar3 != 0x4bd5df01) goto switchD_001139db_caseD_7a98a6bf;
      pcVar2 = "DE";
    }
  }
  iVar1 = strcmp(zeexpression,pcVar2);
  bVar5 = iVar1 == 0;
switchD_001139db_caseD_7a98a6bf:
  return (int)bVar5;
}

Assistant:

int IsRegister(char *zeexpression)
{
	#undef FUNC
	#define FUNC "IsRegister"

	switch (GetCRC(zeexpression)) {
		case CRC_F:if (strcmp(zeexpression,"F")==0) return 1; else return 0;
		case CRC_I:if (strcmp(zeexpression,"I")==0) return 1; else return 0;
		case CRC_R:if (strcmp(zeexpression,"R")==0) return 1; else return 0;
		case CRC_A:if (strcmp(zeexpression,"A")==0) return 1; else return 0;
		case CRC_B:if (strcmp(zeexpression,"B")==0) return 1; else return 0;
		case CRC_C:if (strcmp(zeexpression,"C")==0) return 1; else return 0;
		case CRC_D:if (strcmp(zeexpression,"D")==0) return 1; else return 0;
		case CRC_E:if (strcmp(zeexpression,"E")==0) return 1; else return 0;
		case CRC_H:if (strcmp(zeexpression,"H")==0) return 1; else return 0;
		case CRC_L:if (strcmp(zeexpression,"L")==0) return 1; else return 0;
		case CRC_BC:if (strcmp(zeexpression,"BC")==0) return 1; else return 0;
		case CRC_DE:if (strcmp(zeexpression,"DE")==0) return 1; else return 0;
		case CRC_HL:if (strcmp(zeexpression,"HL")==0) return 1; else return 0;
		case CRC_IX:if (strcmp(zeexpression,"IX")==0) return 1; else return 0;
		case CRC_IY:if (strcmp(zeexpression,"IY")==0) return 1; else return 0;
		case CRC_SP:if (strcmp(zeexpression,"SP")==0) return 1; else return 0;
		case CRC_AF:if (strcmp(zeexpression,"AF")==0) return 1; else return 0;
		case CRC_XH:if (strcmp(zeexpression,"XH")==0) return 1; else return 0;
		case CRC_XL:if (strcmp(zeexpression,"XL")==0) return 1; else return 0;
		case CRC_YH:if (strcmp(zeexpression,"YH")==0) return 1; else return 0;
		case CRC_YL:if (strcmp(zeexpression,"YL")==0) return 1; else return 0;
		case CRC_HX:if (strcmp(zeexpression,"HX")==0) return 1; else return 0;
		case CRC_LX:if (strcmp(zeexpression,"LX")==0) return 1; else return 0;
		case CRC_HY:if (strcmp(zeexpression,"HY")==0) return 1; else return 0;
		case CRC_LY:if (strcmp(zeexpression,"LY")==0) return 1; else return 0;
		case CRC_IXL:if (strcmp(zeexpression,"IXL")==0) return 1; else return 0;
		case CRC_IXH:if (strcmp(zeexpression,"IXH")==0) return 1; else return 0;
		case CRC_IYL:if (strcmp(zeexpression,"IYL")==0) return 1; else return 0;
		case CRC_IYH:if (strcmp(zeexpression,"IYH")==0) return 1; else return 0;
		default:break;
	}
	return 0;
}